

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-keymap.c
# Opt level: O2

void keymap_dump(ang_file *fff)

{
  keymap *pkVar1;
  keymap **ppkVar2;
  ulong uVar3;
  keypress key [2];
  char buf [1024];
  
  uVar3 = (ulong)(player->opts).opt[1];
  ppkVar2 = keymaps + uVar3;
  while (pkVar1 = *ppkVar2, pkVar1 != (keymap *)0x0) {
    key[1].code = 0;
    key[1].mods = '\0';
    key[1]._9_3_ = 0;
    key[0].type = EVT_NONE;
    key[0].code = 0;
    key[0].mods = '\0';
    key[0]._9_3_ = 0;
    key[1].type = EVT_NONE;
    if (pkVar1->user == true) {
      keypress_to_text(buf,0x400,pkVar1->actions,false);
      file_putf(fff,"keymap-act:%s\n",buf);
      key[0].type = (pkVar1->key).type;
      key[0].code = (pkVar1->key).code;
      key[0].mods = (pkVar1->key).mods;
      key[0]._9_3_ = *(undefined3 *)&(pkVar1->key).field_0x9;
      keypress_to_text(buf,0x400,key,true);
      file_putf(fff,"keymap-input:%d:%s\n",uVar3);
      file_putf(fff,"\n");
    }
    ppkVar2 = &pkVar1->next;
  }
  return;
}

Assistant:

void keymap_dump(ang_file *fff)
{
	int mode;
	struct keymap *k;

	if (OPT(player, rogue_like_commands))
		mode = KEYMAP_MODE_ROGUE;
	else
		mode = KEYMAP_MODE_ORIG;

	for (k = keymaps[mode]; k; k = k->next) {
		char buf[1024];
		struct keypress key[2] = { KEYPRESS_NULL, KEYPRESS_NULL };

		if (!k->user) continue;

		/* Encode the action */
		keypress_to_text(buf, sizeof(buf), k->actions, false);
		file_putf(fff, "keymap-act:%s\n", buf);

		/* Convert the key into a string */
		key[0] = k->key;
		keypress_to_text(buf, sizeof(buf), key, true);
		file_putf(fff, "keymap-input:%d:%s\n", mode, buf);

		file_putf(fff, "\n");
	}
}